

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

LY_ERR lyxml_next_attr_content
                 (lyxml_ctx *xmlctx,char **value,size_t *value_len,ly_bool *ws_only,ly_bool *dynamic
                 )

{
  char cVar1;
  LY_ERR LVar2;
  uint uVar3;
  byte *str;
  ulong uVar4;
  char *pcVar5;
  ly_in *plVar6;
  char *pcVar7;
  byte endchar;
  ly_ctx *ctx;
  
  do {
    plVar6 = xmlctx->in;
    cVar1 = *plVar6->current;
    if (cVar1 != '\t') {
      if (cVar1 == '\n') {
        plVar6->line = plVar6->line + 1;
      }
      else if ((cVar1 != '\r') && (cVar1 != ' ')) break;
    }
    ly_in_skip(plVar6,1);
  } while( true );
  if (cVar1 != '\0') {
    if (cVar1 != '=') {
      ctx = xmlctx->ctx;
      uVar3 = LY_VCODE_INSTREXP_len(plVar6->current);
      pcVar7 = xmlctx->in->current;
      pcVar5 = "\'=\'";
LAB_001990e6:
      ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",
              (ulong)uVar3,pcVar7,pcVar5);
      return LY_EVALID;
    }
    ly_in_skip(plVar6,1);
    plVar6 = xmlctx->in;
    str = (byte *)plVar6->current;
    endchar = *str;
    if (endchar != 0) {
      while (uVar4 = (ulong)endchar, endchar < 0x28) {
        if ((0x100002200U >> (uVar4 & 0x3f) & 1) == 0) {
          if (uVar4 != 10) {
            if ((0x8400000000U >> (uVar4 & 0x3f) & 1) != 0) {
              ly_in_skip(plVar6,1);
              if (*xmlctx->in->current != '\0') {
                LVar2 = lyxml_parse_value(xmlctx,endchar,value,value_len,ws_only,dynamic);
                if (LVar2 == LY_SUCCESS) {
                  ly_in_skip(xmlctx->in,1);
                  return LY_SUCCESS;
                }
                return LVar2;
              }
              goto LAB_0019915e;
            }
            break;
          }
          plVar6->line = plVar6->line + 1;
        }
        ly_in_skip(plVar6,1);
        plVar6 = xmlctx->in;
        str = (byte *)plVar6->current;
        endchar = *str;
      }
      if (endchar != 0) {
        ctx = xmlctx->ctx;
        uVar3 = LY_VCODE_INSTREXP_len((char *)str);
        pcVar7 = xmlctx->in->current;
        pcVar5 = "either single or double quotation mark";
        goto LAB_001990e6;
      }
    }
  }
LAB_0019915e:
  ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
  return LY_EVALID;
}

Assistant:

static LY_ERR
lyxml_next_attr_content(struct lyxml_ctx *xmlctx, const char **value, size_t *value_len, ly_bool *ws_only, ly_bool *dynamic)
{
    char quot;

    /* skip WS */
    ign_xmlws(xmlctx);

    /* skip '=' */
    if (xmlctx->in->current[0] == '\0') {
        LOGVAL(xmlctx->ctx, LY_VCODE_EOF);
        return LY_EVALID;
    } else if (xmlctx->in->current[0] != '=') {
        LOGVAL(xmlctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(xmlctx->in->current),
                xmlctx->in->current, "'='");
        return LY_EVALID;
    }
    move_input(xmlctx, 1);

    /* skip WS */
    ign_xmlws(xmlctx);

    /* find quotes */
    if (xmlctx->in->current[0] == '\0') {
        LOGVAL(xmlctx->ctx, LY_VCODE_EOF);
        return LY_EVALID;
    } else if ((xmlctx->in->current[0] != '\'') && (xmlctx->in->current[0] != '\"')) {
        LOGVAL(xmlctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(xmlctx->in->current),
                xmlctx->in->current, "either single or double quotation mark");
        return LY_EVALID;
    }

    /* remember quote */
    quot = xmlctx->in->current[0];
    move_input(xmlctx, 1);

    /* parse attribute value */
    LY_CHECK_RET(lyxml_parse_value(xmlctx, quot, (char **)value, value_len, ws_only, dynamic));

    /* move after ending quote (without checking for EOF) */
    ly_in_skip(xmlctx->in, 1);

    return LY_SUCCESS;
}